

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

void asl::Random::getBytes(void *buffer,int n)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  Random random;
  
  __stream = fopen("/dev/urandom","rb");
  if (__stream != (FILE *)0x0) {
    sVar2 = fread(buffer,1,(long)n,__stream);
    fclose(__stream);
    if ((int)sVar2 == n) {
      return;
    }
  }
  Random(&random,true,true);
  uVar4 = 0;
  uVar3 = (ulong)(uint)n;
  if (n < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    iVar1 = operator()(&random,0xff);
    *(char *)((long)buffer + uVar4) = (char)iVar1;
  }
  return;
}

Assistant:

void Random::getBytes(void* buffer, int n)
{
#ifdef _WIN32
	HCRYPTPROV cp = 0;
	if (CryptAcquireContextW(&cp, NULL, NULL, PROV_RSA_FULL, 0))
	{
		if (CryptGenRandom(cp, n, (BYTE*)buffer))
		{
			CryptReleaseContext(cp, 0);
			return;
		}
	}
#else
	FILE* f = fopen("/dev/urandom", "rb");
	if (f)
	{
		if((int)fread(buffer, 1, n, f) == n) {
			fclose(f);
			return;
		}
		fclose(f);
	}
#endif
	Random random;
	for(int i=0; i<n; i++)
		((byte*)buffer)[i] = (byte)random(255);
}